

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::mousePressEvent(QToolButton *this,QMouseEvent *e)

{
  undefined1 auVar1 [16];
  bool bVar2;
  MouseButton MVar3;
  QToolButtonPrivate *this_00;
  QStyle *pQVar4;
  QSinglePointEvent *in_RSI;
  QStyleOptionToolButton *in_RDI;
  long in_FS_OFFSET;
  QToolButtonPrivate *d;
  QRect popupr;
  QStyleOptionToolButton opt;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QPoint local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QToolButton *)0x70adc5);
  memset(local_a0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)0x70ade8);
  (**(code **)(*(long *)&(in_RDI->super_QStyleOptionComplex).super_QStyleOption + 0x1b8))
            (in_RDI,local_a0);
  MVar3 = QSinglePointEvent::button(in_RSI);
  auVar1._8_8_ = local_b0._8_8_;
  auVar1._0_8_ = local_b0._0_8_;
  if ((MVar3 == LeftButton) && (local_b0 = auVar1, this_00->popupMode == MenuButtonPopup)) {
    local_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QWidget::style((QWidget *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)
                           );
    local_b0 = (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,4,local_a0,2,in_RDI);
    bVar2 = QRect::isValid((QRect *)in_RDI);
    bVar5 = 0;
    if (bVar2) {
      QSinglePointEvent::position((QSinglePointEvent *)0x70ae8f);
      local_b8 = QPointF::toPoint((QPointF *)this_00);
      bVar5 = QRect::contains((QPoint *)local_b0,SUB81(&local_b8,0));
    }
    if ((bVar5 & 1) != 0) {
      this_00->field_0x2ec = this_00->field_0x2ec & 0xfc | 1;
      showMenu((QToolButton *)in_RDI);
      goto LAB_0070af24;
    }
  }
  this_00->field_0x2ec = this_00->field_0x2ec & 0xfc | 2;
  QAbstractButton::mousePressEvent
            ((QAbstractButton *)this_00,
             (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
LAB_0070af24:
  QStyleOptionToolButton::~QStyleOptionToolButton(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButton::mousePressEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
#if QT_CONFIG(menu)
    QStyleOptionToolButton opt;
    initStyleOption(&opt);
    if (e->button() == Qt::LeftButton && (d->popupMode == MenuButtonPopup)) {
        QRect popupr = style()->subControlRect(QStyle::CC_ToolButton, &opt,
                                               QStyle::SC_ToolButtonMenu, this);
        if (popupr.isValid() && popupr.contains(e->position().toPoint())) {
            d->buttonPressed = QToolButtonPrivate::MenuButtonPressed;
            showMenu();
            return;
        }
    }
#endif
    d->buttonPressed = QToolButtonPrivate::ToolButtonPressed;
    QAbstractButton::mousePressEvent(e);
}